

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QString::trimmed_helper(QString *str)

{
  QString *in_RDI;
  QString *unaff_retaddr;
  
  QStringAlgorithms<QString>::trimmed_helper(unaff_retaddr);
  return in_RDI;
}

Assistant:

QString QString::trimmed_helper(QString &str)
{
    return QStringAlgorithms<QString>::trimmed_helper(str);
}